

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_opaque_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::InlineOpaquePass::IsOpaqueType(InlineOpaquePass *this,uint32_t typeId)

{
  Op OVar1;
  IRContext *this_00;
  pointer pOVar2;
  uint **ppuVar3;
  bool bVar4;
  char cVar5;
  Instruction *this_01;
  uint **ppuVar6;
  uint uVar7;
  pointer pOVar8;
  bool bVar9;
  InlineOpaquePass *local_58;
  undefined8 uStack_50;
  code *local_48;
  code *pcStack_40;
  uint *local_38;
  
  while( true ) {
    this_00 = (this->super_InlinePass).super_Pass.context_;
    if ((this_00->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(this_00);
    }
    this_01 = analysis::DefUseManager::GetDef
                        ((this_00->def_use_mgr_)._M_t.
                         super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                         .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                         _M_head_impl,typeId);
    OVar1 = this_01->opcode_;
    if (OVar1 != OpTypePointer) break;
    uVar7 = (this_01->has_result_id_ & 1) + 1;
    if (this_01->has_type_id_ == false) {
      uVar7 = (uint)this_01->has_result_id_;
    }
    typeId = Instruction::GetSingleWordOperand(this_01,uVar7 + 1);
  }
  if (OVar1 - OpTypeImage < 3) {
    bVar9 = true;
  }
  else if (OVar1 == OpTypeStruct) {
    uStack_50 = 0;
    pcStack_40 = std::
                 _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_opaque_pass.cpp:43:35)>
                 ::_M_invoke;
    local_48 = std::
               _Function_handler<bool_(const_unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/inline_opaque_pass.cpp:43:35)>
               ::_M_manager;
    pOVar8 = (this_01->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pOVar2 = (this_01->operands_).
             super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    bVar9 = pOVar8 == pOVar2;
    local_58 = this;
    if (!bVar9) {
      bVar9 = false;
      do {
        bVar4 = spvIsInIdType(pOVar8->type);
        if (bVar4) {
          ppuVar3 = (uint **)(pOVar8->words).large_data_._M_t.
                             super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                             .
                             super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                             ._M_head_impl;
          ppuVar6 = &(pOVar8->words).small_data_;
          if (ppuVar3 != (uint **)0x0) {
            ppuVar6 = ppuVar3;
          }
          local_38 = *ppuVar6;
          if (local_48 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          cVar5 = (*pcStack_40)(&local_58,&local_38);
          if (cVar5 == '\0') break;
        }
        pOVar8 = pOVar8 + 1;
        bVar9 = pOVar8 == pOVar2;
      } while (!bVar9);
    }
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
    bVar9 = (bool)(bVar9 ^ 1);
  }
  else {
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

bool InlineOpaquePass::IsOpaqueType(uint32_t typeId) {
  const Instruction* typeInst = get_def_use_mgr()->GetDef(typeId);
  switch (typeInst->opcode()) {
    case spv::Op::OpTypeSampler:
    case spv::Op::OpTypeImage:
    case spv::Op::OpTypeSampledImage:
      return true;
    case spv::Op::OpTypePointer:
      return IsOpaqueType(
          typeInst->GetSingleWordInOperand(kTypePointerTypeIdInIdx));
    default:
      break;
  }
  // TODO(greg-lunarg): Handle arrays containing opaque type
  if (typeInst->opcode() != spv::Op::OpTypeStruct) return false;
  // Return true if any member is opaque
  return !typeInst->WhileEachInId([this](const uint32_t* tid) {
    if (IsOpaqueType(*tid)) return false;
    return true;
  });
}